

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

cf_bool_t cf_array_erase(cf_array_t *self,int index)

{
  ulong local_28;
  cf_size_t i;
  int index_local;
  cf_array_t *self_local;
  
  if (((index < -1) || (self->elm_count <= (ulong)(long)index)) || (self->elm_count == 0)) {
    self_local._4_4_ = 0;
  }
  else if (index == -1) {
    self->elm_count = self->elm_count - 1;
    self_local._4_4_ = 1;
  }
  else {
    for (local_28 = (ulong)index; local_28 < self->elm_count - 1; local_28 = local_28 + 1) {
      cf_memcpy_s((cf_void_t *)((long)self->elm_start + self->elm_size * local_28),self->elm_size,
                  (cf_void_t *)((long)self->elm_start + self->elm_size * (local_28 + 1)),
                  self->elm_size);
    }
    self->elm_count = self->elm_count - 1;
    self_local._4_4_ = 1;
  }
  return self_local._4_4_;
}

Assistant:

cf_bool_t cf_array_erase(cf_array_t* self, int index) {
    cf_size_t i;
    if (index < CF_ARRAY_END_INDEX || (cf_size_t)index >= self->elm_count || self->elm_count <= 0) {
        return CF_FALSE;
    }
    if (index == CF_ARRAY_END_INDEX) {
        self->elm_count -= 1;
        return CF_TRUE;
    }
    for (i = index; i < self->elm_count - 1; i++) {
        cf_memcpy_s((cf_uint8_t*)self->elm_start + self->elm_size * i,
            self->elm_size,
            (cf_uint8_t*)self->elm_start + self->elm_size * (i + 1),
            self->elm_size);
    }
    self->elm_count -= 1;
    return CF_TRUE;
}